

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

NamedTextures * __thiscall
pbrt::ParsedScene::CreateTextures
          (NamedTextures *__return_storage_ptr__,ParsedScene *this,Allocator alloc,bool gpu)

{
  _Rb_tree_header *p_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
  *this_01;
  FileLoc *loc;
  ParameterDictionary *dict;
  unsigned_long uVar2;
  pointer ppVar3;
  string *name;
  TextureSceneEntity *pTVar4;
  SpectrumTextureHandle SVar5;
  void *pvVar6;
  bool bVar7;
  int iVar8;
  pointer ppVar9;
  iterator iVar10;
  iterator *piVar11;
  mapped_type *pmVar12;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
  *this_02;
  mapped_type *pmVar13;
  iterator iVar14;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar15;
  TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  *pTVar16;
  bool gpu_local;
  SpectrumTextureHandle unboundedTex;
  int nMissingTextures;
  NamedTextures *local_278;
  ParsedScene *local_270;
  TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  *local_268;
  iterator iStack_260;
  TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  *local_258;
  TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  *local_248;
  iterator iStack_240;
  TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  *local_238;
  Allocator alloc_local;
  FloatTextureHandle t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  TextureParameterDictionary texDict;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  void *local_1e8;
  iterator iStack_1e0;
  TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  *local_1d8;
  void *local_1c8;
  iterator iStack_1c0;
  TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  *local_1b8;
  string ret;
  mutex mutex;
  SpectrumTextureHandle illumTex;
  undefined8 *local_d8;
  undefined8 uStack_d0;
  code *pcStack_c8;
  code *pcStack_c0;
  undefined8 *local_b8;
  undefined8 uStack_b0;
  code *pcStack_a8;
  code *pcStack_a0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seenSpectrumTextureFilenames;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seenFloatTextureFilenames;
  
  p_Var1 = &(__return_storage_ptr__->floatTextures)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->floatTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->floatTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->floatTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->floatTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->floatTextures)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->albedoSpectrumTextures)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->albedoSpectrumTextures)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (__return_storage_ptr__->albedoSpectrumTextures)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->albedoSpectrumTextures)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (__return_storage_ptr__->albedoSpectrumTextures)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (__return_storage_ptr__->albedoSpectrumTextures)._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  p_Var1 = &(__return_storage_ptr__->unboundedSpectrumTextures)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->unboundedSpectrumTextures)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (__return_storage_ptr__->unboundedSpectrumTextures)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->unboundedSpectrumTextures)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (__return_storage_ptr__->unboundedSpectrumTextures)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (__return_storage_ptr__->unboundedSpectrumTextures)._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->illuminantSpectrumTextures)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->illuminantSpectrumTextures)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (__return_storage_ptr__->illuminantSpectrumTextures)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->illuminantSpectrumTextures)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (__return_storage_ptr__->illuminantSpectrumTextures)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (__return_storage_ptr__->illuminantSpectrumTextures)._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  seenFloatTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &seenFloatTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header;
  seenFloatTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  seenFloatTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  seenFloatTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  seenSpectrumTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &seenSpectrumTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header;
  seenSpectrumTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  seenSpectrumTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  seenSpectrumTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b8 = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               *)0x0;
  local_1c8 = (void *)0x0;
  iStack_1c0._M_current = (unsigned_long *)0x0;
  local_238 = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               *)0x0;
  local_248 = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               *)0x0;
  iStack_240._M_current = (unsigned_long *)0x0;
  local_1d8 = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               *)0x0;
  local_1e8 = (void *)0x0;
  iStack_1e0._M_current = (unsigned_long *)0x0;
  local_258 = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               *)0x0;
  local_268 = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               *)0x0;
  iStack_260._M_current = (unsigned_long *)0x0;
  nMissingTextures = 0;
  unboundedTex.
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
           )0;
  ppVar9 = (this->floatTextures).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  gpu_local = gpu;
  local_278 = __return_storage_ptr__;
  local_270 = this;
  alloc_local.memoryResource = alloc.memoryResource;
  seenSpectrumTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       seenSpectrumTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  seenFloatTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       seenFloatTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->floatTextures).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar9) {
    do {
      SVar5.
      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = unboundedTex.
              super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
      if (ppVar9[(long)unboundedTex.
                       super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                       .bits].second.super_TransformedSceneEntity.renderFromObject.actuallyAnimated
          == true) {
        Warning(&ppVar9[(long)unboundedTex.
                              super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                              .bits].second.super_TransformedSceneEntity.super_SceneEntity.loc,
                "Animated world to texture transforms are not supported. Using start transform.");
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)&ppVar9[(long)SVar5.
                                               super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                                               .bits].second.texName);
      if (iVar8 == 0) {
        texDict.dict = (ParameterDictionary *)&local_1f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&texDict,"filename","");
        t.
        super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
        .bits = (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                 )&local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)&t,"");
        ParameterDictionary::GetOneString
                  (&ret,&ppVar9[(long)SVar5.
                                      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                                      .bits].second.super_TransformedSceneEntity.super_SceneEntity.
                         parameters,(string *)&texDict,(string *)&t);
        ResolveFilename((string *)&mutex,&ret);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ret._M_dataplus._M_p != &ret.field_2) {
          operator_delete(ret._M_dataplus._M_p,ret.field_2._M_allocated_capacity + 1);
        }
        if (t.
            super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
            .bits != (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                      )&local_218) {
          operator_delete((void *)t.
                                  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                                  .bits,local_218._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)texDict.dict != &local_1f8) {
          operator_delete(texDict.dict,local_1f8._M_allocated_capacity + 1);
        }
        if (mutex.super___mutex_base._M_mutex._8_8_ != 0) {
          bVar7 = FileExists((string *)&mutex);
          if (!bVar7) {
            ret._M_dataplus._M_p = (pointer)&ret.field_2;
            ret._M_string_length = 0;
            ret.field_2._M_allocated_capacity =
                 ret.field_2._M_allocated_capacity & 0xffffffffffffff00;
            detail::stringPrintfRecursive<std::__cxx11::string&>
                      (&ret,"%s: file not found.",(string *)&mutex);
            Error(&ppVar9[(long)SVar5.
                                super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                                .bits].second.super_TransformedSceneEntity.super_SceneEntity.loc,
                  ret._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)ret._M_dataplus._M_p != &ret.field_2) {
              operator_delete(ret._M_dataplus._M_p,ret.field_2._M_allocated_capacity + 1);
            }
            nMissingTextures = nMissingTextures + 1;
          }
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&seenFloatTextureFilenames._M_t,(string *)&mutex);
          if ((_Rb_tree_header *)iVar10._M_node ==
              &seenFloatTextureFilenames._M_t._M_impl.super__Rb_tree_header) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&seenFloatTextureFilenames,(string *)&mutex);
            if ((TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                 *)iStack_1c0._M_current == local_1b8) {
              pvVar15 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1c8;
              iVar14._M_current = iStack_1c0._M_current;
              goto LAB_001df274;
            }
            *iStack_1c0._M_current =
                 (unsigned_long)
                 unboundedTex.
                 super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                 .bits;
            piVar11 = &iStack_1c0;
            iVar14._M_current = iStack_1c0._M_current;
          }
          else {
            if ((TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                 *)iStack_240._M_current == local_238) {
              pvVar15 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&local_248;
              iVar14._M_current = iStack_240._M_current;
LAB_001df274:
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(pvVar15,iVar14,(unsigned_long *)&unboundedTex)
              ;
              goto LAB_001df27e;
            }
            *iStack_240._M_current =
                 (unsigned_long)
                 unboundedTex.
                 super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                 .bits;
            piVar11 = &iStack_240;
            iVar14._M_current = iStack_240._M_current;
          }
          piVar11->_M_current =
               &((TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                  *)iVar14._M_current)[1].bits;
        }
LAB_001df27e:
        if ((undefined1 *)mutex.super___mutex_base._M_mutex.__align !=
            (undefined1 *)((long)&mutex.super___mutex_base._M_mutex + 0x10)) {
          operator_delete((void *)mutex.super___mutex_base._M_mutex.__align,
                          mutex.super___mutex_base._M_mutex._16_8_ + 1);
        }
      }
      else if ((TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                *)iStack_240._M_current == local_238) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_248,iStack_240,
                   (unsigned_long *)&unboundedTex);
      }
      else {
        *iStack_240._M_current =
             (unsigned_long)
             unboundedTex.
             super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             .bits;
        iStack_240._M_current = iStack_240._M_current + 1;
      }
      unboundedTex.
      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               )((long)unboundedTex.
                       super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                       .bits + 1);
      ppVar9 = (local_270->floatTextures).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while ((ulong)unboundedTex.
                    super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                    .bits <
             (ulong)(((long)(local_270->floatTextures).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9 >> 3) *
                    0x2a4bafdc61f2a4bb));
  }
  unboundedTex.
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
           )0;
  ppVar9 = (local_270->spectrumTextures).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((local_270->spectrumTextures).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar9) {
    do {
      SVar5.
      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = unboundedTex.
              super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
      if (ppVar9[(long)unboundedTex.
                       super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                       .bits].second.super_TransformedSceneEntity.renderFromObject.actuallyAnimated
          == true) {
        Warning(&ppVar9[(long)unboundedTex.
                              super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                              .bits].second.super_TransformedSceneEntity.super_SceneEntity.loc,
                "Animated world to texture transforms are not supported. Using start transform.");
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)&ppVar9[(long)SVar5.
                                               super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                                               .bits].second.texName);
      if (iVar8 == 0) {
        texDict.dict = (ParameterDictionary *)&local_1f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&texDict,"filename","");
        t.
        super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
        .bits = (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                 )&local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)&t,"");
        ParameterDictionary::GetOneString
                  (&ret,&ppVar9[(long)SVar5.
                                      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                                      .bits].second.super_TransformedSceneEntity.super_SceneEntity.
                         parameters,(string *)&texDict,(string *)&t);
        ResolveFilename((string *)&mutex,&ret);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ret._M_dataplus._M_p != &ret.field_2) {
          operator_delete(ret._M_dataplus._M_p,ret.field_2._M_allocated_capacity + 1);
        }
        if (t.
            super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
            .bits != (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                      )&local_218) {
          operator_delete((void *)t.
                                  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                                  .bits,local_218._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)texDict.dict != &local_1f8) {
          operator_delete(texDict.dict,local_1f8._M_allocated_capacity + 1);
        }
        if (mutex.super___mutex_base._M_mutex._8_8_ != 0) {
          bVar7 = FileExists((string *)&mutex);
          if (!bVar7) {
            ret._M_dataplus._M_p = (pointer)&ret.field_2;
            ret._M_string_length = 0;
            ret.field_2._M_allocated_capacity =
                 ret.field_2._M_allocated_capacity & 0xffffffffffffff00;
            detail::stringPrintfRecursive<std::__cxx11::string&>
                      (&ret,"%s: file not found.",(string *)&mutex);
            Error(&ppVar9[(long)SVar5.
                                super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                                .bits].second.super_TransformedSceneEntity.super_SceneEntity.loc,
                  ret._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)ret._M_dataplus._M_p != &ret.field_2) {
              operator_delete(ret._M_dataplus._M_p,ret.field_2._M_allocated_capacity + 1);
            }
            nMissingTextures = nMissingTextures + 1;
          }
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&seenSpectrumTextureFilenames._M_t,(string *)&mutex);
          if ((_Rb_tree_header *)iVar10._M_node ==
              &seenSpectrumTextureFilenames._M_t._M_impl.super__Rb_tree_header) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&seenSpectrumTextureFilenames,(string *)&mutex);
            if ((TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                 *)iStack_1e0._M_current == local_1d8) {
              pvVar15 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1e8;
              iVar14._M_current = iStack_1e0._M_current;
              goto LAB_001df574;
            }
            *iStack_1e0._M_current =
                 (unsigned_long)
                 unboundedTex.
                 super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                 .bits;
            piVar11 = &iStack_1e0;
            iVar14._M_current = iStack_1e0._M_current;
          }
          else {
            if ((TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                 *)iStack_260._M_current == local_258) {
              pvVar15 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&local_268;
              iVar14._M_current = iStack_260._M_current;
LAB_001df574:
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(pvVar15,iVar14,(unsigned_long *)&unboundedTex)
              ;
              goto LAB_001df57e;
            }
            *iStack_260._M_current =
                 (unsigned_long)
                 unboundedTex.
                 super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                 .bits;
            piVar11 = &iStack_260;
            iVar14._M_current = iStack_260._M_current;
          }
          piVar11->_M_current =
               &((TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                  *)iVar14._M_current)[1].bits;
        }
LAB_001df57e:
        if ((undefined1 *)mutex.super___mutex_base._M_mutex.__align !=
            (undefined1 *)((long)&mutex.super___mutex_base._M_mutex + 0x10)) {
          operator_delete((void *)mutex.super___mutex_base._M_mutex.__align,
                          mutex.super___mutex_base._M_mutex._16_8_ + 1);
        }
      }
      else if ((TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                *)iStack_260._M_current == local_258) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_268,iStack_260,
                   (unsigned_long *)&unboundedTex);
      }
      else {
        *iStack_260._M_current =
             (unsigned_long)
             unboundedTex.
             super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             .bits;
        iStack_260._M_current = iStack_260._M_current + 1;
      }
      unboundedTex.
      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               )((long)unboundedTex.
                       super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                       .bits + 1);
      ppVar9 = (local_270->spectrumTextures).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while ((ulong)unboundedTex.
                    super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                    .bits <
             (ulong)(((long)(local_270->spectrumTextures).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9 >> 3) *
                    0x2a4bafdc61f2a4bb));
  }
  if (nMissingTextures < 1) {
    if (LOGGING_LogLevel < 1) {
      mutex.super___mutex_base._M_mutex.__align = (long)iStack_1c0._M_current - (long)local_1c8 >> 3
      ;
      texDict.dict = (ParameterDictionary *)((long)iStack_1e0._M_current - (long)local_1e8 >> 3);
      t.
      super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
      .bits = (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
               )((long)iStack_240._M_current - (long)local_248 >> 3);
      unboundedTex.
      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               )((long)iStack_260._M_current - (long)local_268 >> 3);
      ret._M_string_length = 0;
      ret.field_2._M_allocated_capacity = ret.field_2._M_allocated_capacity & 0xffffffffffffff00;
      ret._M_dataplus._M_p = (pointer)&ret.field_2;
      detail::stringPrintfRecursive<unsigned_long,unsigned_long,unsigned_long,unsigned_long>
                (&ret,"Loading %d,%d textures in parallel, %d,%d serially",(unsigned_long *)&mutex,
                 (unsigned_long *)&texDict,(unsigned_long *)&t,(unsigned_long *)&unboundedTex);
      Log(Verbose,
          "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
          ,0x335,ret._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ret._M_dataplus._M_p != &ret.field_2) {
        operator_delete(ret._M_dataplus._M_p,ret.field_2._M_allocated_capacity + 1);
      }
    }
    iVar14._M_current = iStack_1c0._M_current;
    pvVar6 = local_1c8;
    mutex.super___mutex_base._M_mutex.__align = 0;
    mutex.super___mutex_base._M_mutex._8_8_ = 0;
    mutex.super___mutex_base._M_mutex._16_8_ = 0;
    mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    local_b8 = (undefined8 *)0x0;
    uStack_b0 = 0;
    pcStack_a8 = (code *)0x0;
    pcStack_a0 = (code *)0x0;
    local_b8 = (undefined8 *)operator_new(0x30);
    *local_b8 = local_270;
    local_b8[1] = &local_1c8;
    local_b8[2] = &alloc_local;
    local_b8[3] = &gpu_local;
    local_b8[4] = &mutex;
    local_b8[5] = local_278;
    ret._M_dataplus._M_p = (pointer)&local_b8;
    pcStack_a0 = std::
                 _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp:826:50)>
                 ::_M_invoke;
    pcStack_a8 = std::
                 _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp:826:50)>
                 ::_M_manager;
    ret._M_string_length = 0;
    ret.field_2._8_8_ =
         std::
         _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
         ::_M_invoke;
    ret.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
         ::_M_manager;
    ParallelFor(0,(long)iVar14._M_current - (long)pvVar6 >> 3,(function<void_(long,_long)> *)&ret);
    if (ret.field_2._M_allocated_capacity != 0) {
      (*(code *)ret.field_2._M_allocated_capacity)(&ret,&ret,3);
    }
    if (pcStack_a8 != (code *)0x0) {
      (*pcStack_a8)(&local_b8,&local_b8,3);
    }
    iVar14._M_current = iStack_1e0._M_current;
    pvVar6 = local_1e8;
    local_d8 = (undefined8 *)0x0;
    uStack_d0 = 0;
    pcStack_c8 = (code *)0x0;
    pcStack_c0 = (code *)0x0;
    local_d8 = (undefined8 *)operator_new(0x30);
    *local_d8 = local_270;
    local_d8[1] = &local_1e8;
    local_d8[2] = &alloc_local;
    local_d8[3] = &gpu_local;
    local_d8[4] = &mutex;
    local_d8[5] = local_278;
    ret._M_dataplus._M_p = (pointer)&local_d8;
    pcStack_c0 = std::
                 _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp:839:53)>
                 ::_M_invoke;
    pcStack_c8 = std::
                 _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp:839:53)>
                 ::_M_manager;
    ret._M_string_length = 0;
    ret.field_2._8_8_ =
         std::
         _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
         ::_M_invoke;
    ret.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
         ::_M_manager;
    ParallelFor(0,(long)iVar14._M_current - (long)pvVar6 >> 3,(function<void_(long,_long)> *)&ret);
    if (ret.field_2._M_allocated_capacity != 0) {
      (*(code *)ret.field_2._M_allocated_capacity)(&ret,&ret,3);
    }
    if (pcStack_c8 != (code *)0x0) {
      (*pcStack_c8)(&local_d8,&local_d8,3);
    }
    if (LOGGING_LogLevel < 1) {
      Log(Verbose,
          "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
          ,0x35e,"Loading serial textures");
    }
    iVar14._M_current = iStack_240._M_current;
    if (local_248 !=
        (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
         *)iStack_240._M_current) {
      pTVar16 = local_248;
      do {
        ppVar9 = (local_270->floatTextures).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = pTVar16->bits;
        dict = (ParameterDictionary *)
               ((long)&ppVar9[uVar2].second.super_TransformedSceneEntity.super_SceneEntity + 0x20);
        ret._M_dataplus._M_p = (pointer)dict[1].params.field_2.fixed[1];
        ret._M_string_length = (size_type)dict[1].params.field_2.fixed[2];
        ret.field_2._M_allocated_capacity = (size_type)dict[1].params.field_2.fixed[3];
        ret.field_2._8_8_ = dict[1].params.field_2.fixed[4];
        TextureParameterDictionary::TextureParameterDictionary(&texDict,dict,local_278);
        ppVar9 = ppVar9 + uVar2;
        FloatTextureHandle::Create
                  (&t,&(ppVar9->second).texName,(Transform *)&ret,&texDict,
                   (FileLoc *)
                   ((long)&(ppVar9->second).super_TransformedSceneEntity.super_SceneEntity + 0x88),
                   alloc_local,gpu_local);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
                  ::operator[](&local_278->floatTextures,&ppVar9->first);
        (pmVar12->
        super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
        ).bits = (uintptr_t)
                 t.
                 super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                 .bits;
        pTVar16 = pTVar16 + 1;
      } while (pTVar16 !=
               (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                *)iVar14._M_current);
    }
    iVar14._M_current = iStack_260._M_current;
    if (local_268 !=
        (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
         *)iStack_260._M_current) {
      this_00 = &local_278->albedoSpectrumTextures;
      this_01 = &local_278->unboundedSpectrumTextures;
      this_02 = &local_278->illuminantSpectrumTextures;
      pTVar16 = local_268;
      do {
        ppVar3 = (local_270->spectrumTextures).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = pTVar16->bits;
        ppVar9 = ppVar3 + uVar2;
        if (*(bool *)((long)&ppVar3[uVar2].second.super_TransformedSceneEntity.renderFromObject +
                     0x108) == true) {
          Warning((FileLoc *)
                  ((long)&(ppVar9->second).super_TransformedSceneEntity.super_SceneEntity + 0x88),
                  "Animated world to texture transform not supported. Using start transform.");
        }
        pTVar4 = &ppVar3[uVar2].second;
        ret._M_dataplus._M_p =
             *(pointer *)&(pTVar4->super_TransformedSceneEntity).renderFromObject.startTransform.m;
        ret._M_string_length =
             *(size_type *)((long)&(pTVar4->super_TransformedSceneEntity).renderFromObject + 8);
        ret.field_2._M_allocated_capacity =
             *(undefined8 *)
              *(Float (*) [4])
               ((long)&(pTVar4->super_TransformedSceneEntity).renderFromObject + 0x10);
        ret.field_2._8_8_ =
             *(undefined8 *)((long)&(pTVar4->super_TransformedSceneEntity).renderFromObject + 0x18);
        TextureParameterDictionary::TextureParameterDictionary
                  (&texDict,(ParameterDictionary *)
                            ((long)&(ppVar9->second).super_TransformedSceneEntity.super_SceneEntity
                            + 0x20),local_278);
        name = &(ppVar9->second).texName;
        loc = (FileLoc *)
              ((long)&(ppVar9->second).super_TransformedSceneEntity.super_SceneEntity + 0x88);
        SpectrumTextureHandle::Create
                  ((SpectrumTextureHandle *)&t,name,(Transform *)&ret,&texDict,Albedo,loc,
                   alloc_local,gpu_local);
        SpectrumTextureHandle::Create
                  (&unboundedTex,name,(Transform *)&ret,&texDict,Unbounded,loc,alloc_local,gpu_local
                  );
        SpectrumTextureHandle::Create
                  (&illumTex,name,(Transform *)&ret,&texDict,Illuminant,loc,alloc_local,gpu_local);
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                  ::operator[](this_00,&ppVar9->first);
        (pmVar13->
        super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
        ).bits = (uintptr_t)
                 t.
                 super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                 .bits;
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                  ::operator[](this_01,&ppVar9->first);
        (pmVar13->
        super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
        ).bits = (uintptr_t)
                 unboundedTex.
                 super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                 .bits;
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                  ::operator[](this_02,&ppVar9->first);
        (pmVar13->
        super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
        ).bits = (uintptr_t)
                 illumTex.
                 super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                 .bits;
        pTVar16 = pTVar16 + 1;
      } while (pTVar16 !=
               (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                *)iVar14._M_current);
    }
    if (LOGGING_LogLevel < 1) {
      Log(Verbose,
          "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
          ,0x381,"Done creating textures");
    }
    if (local_268 !=
        (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
         *)0x0) {
      operator_delete(local_268,(long)local_258 - (long)local_268);
    }
    if (local_1e8 != (void *)0x0) {
      operator_delete(local_1e8,(long)local_1d8 - (long)local_1e8);
    }
    if (local_248 !=
        (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
         *)0x0) {
      operator_delete(local_248,(long)local_238 - (long)local_248);
    }
    if (local_1c8 != (void *)0x0) {
      operator_delete(local_1c8,(long)local_1b8 - (long)local_1c8);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&seenSpectrumTextureFilenames._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&seenFloatTextureFilenames._M_t);
    return local_278;
  }
  ErrorExit<int&>("%d missing textures",&nMissingTextures);
}

Assistant:

NamedTextures ParsedScene::CreateTextures(Allocator alloc, bool gpu) const {
    NamedTextures textures;

    std::set<std::string> seenFloatTextureFilenames, seenSpectrumTextureFilenames;
    std::vector<size_t> parallelFloatTextures, serialFloatTextures;
    std::vector<size_t> parallelSpectrumTextures, serialSpectrumTextures;

    // Figure out which textures to load in parallel
    // Need to be careful since two textures can use the same image file;
    // we only want to load it once in that case...
    int nMissingTextures = 0;
    for (size_t i = 0; i < floatTextures.size(); ++i) {
        const auto &tex = floatTextures[i];

        if (tex.second.renderFromObject.IsAnimated())
            Warning(&tex.second.loc,
                    "Animated world to texture transforms are not supported. "
                    "Using start transform.");

        if (tex.second.texName != "imagemap") {
            serialFloatTextures.push_back(i);
            continue;
        }

        std::string filename =
            ResolveFilename(tex.second.parameters.GetOneString("filename", ""));
        if (filename.empty())
            continue;
        if (!FileExists(filename)) {
            Error(&tex.second.loc, "%s: file not found.", filename);
            ++nMissingTextures;
        }

        if (seenFloatTextureFilenames.find(filename) == seenFloatTextureFilenames.end()) {
            seenFloatTextureFilenames.insert(filename);
            parallelFloatTextures.push_back(i);
        } else
            serialFloatTextures.push_back(i);
    }
    for (size_t i = 0; i < spectrumTextures.size(); ++i) {
        const auto &tex = spectrumTextures[i];

        if (tex.second.renderFromObject.IsAnimated())
            Warning(&tex.second.loc,
                    "Animated world to texture transforms are not supported. "
                    "Using start transform.");

        if (tex.second.texName != "imagemap") {
            serialSpectrumTextures.push_back(i);
            continue;
        }

        std::string filename =
            ResolveFilename(tex.second.parameters.GetOneString("filename", ""));
        if (filename.empty())
            continue;
        if (!FileExists(filename)) {
            Error(&tex.second.loc, "%s: file not found.", filename);
            ++nMissingTextures;
        }

        if (seenSpectrumTextureFilenames.find(filename) ==
            seenSpectrumTextureFilenames.end()) {
            seenSpectrumTextureFilenames.insert(filename);
            parallelSpectrumTextures.push_back(i);
        } else
            serialSpectrumTextures.push_back(i);
    }

    if (nMissingTextures > 0)
        ErrorExit("%d missing textures", nMissingTextures);

    LOG_VERBOSE("Loading %d,%d textures in parallel, %d,%d serially",
                parallelFloatTextures.size(), parallelSpectrumTextures.size(),
                serialFloatTextures.size(), serialSpectrumTextures.size());

    // Load textures in parallel
    std::mutex mutex;

    ParallelFor(0, parallelFloatTextures.size(), [&](int64_t i) {
        const auto &tex = floatTextures[parallelFloatTextures[i]];

        pbrt::Transform renderFromTexture = tex.second.renderFromObject.startTransform;
        // Pass nullptr for the textures, since they shouldn't be accessed
        // anyway.
        TextureParameterDictionary texDict(&tex.second.parameters, nullptr);
        FloatTextureHandle t = FloatTextureHandle::Create(
            tex.second.texName, renderFromTexture, texDict, &tex.second.loc, alloc, gpu);
        std::lock_guard<std::mutex> lock(mutex);
        textures.floatTextures[tex.first] = t;
    });

    ParallelFor(0, parallelSpectrumTextures.size(), [&](int64_t i) {
        const auto &tex = spectrumTextures[parallelSpectrumTextures[i]];

        pbrt::Transform renderFromTexture = tex.second.renderFromObject.startTransform;
        // nullptr for the textures, as above.
        TextureParameterDictionary texDict(&tex.second.parameters, nullptr);
        SpectrumTextureHandle albedoTex = SpectrumTextureHandle::Create(
            tex.second.texName, renderFromTexture, texDict, SpectrumType::Albedo,
            &tex.second.loc, alloc, gpu);
        // These should be fast since they should hit the texture cache
        SpectrumTextureHandle unboundedTex = SpectrumTextureHandle::Create(
            tex.second.texName, renderFromTexture, texDict, SpectrumType::Unbounded,
            &tex.second.loc, alloc, gpu);
        SpectrumTextureHandle illumTex = SpectrumTextureHandle::Create(
            tex.second.texName, renderFromTexture, texDict, SpectrumType::Illuminant,
            &tex.second.loc, alloc, gpu);

        std::lock_guard<std::mutex> lock(mutex);
        textures.albedoSpectrumTextures[tex.first] = albedoTex;
        textures.unboundedSpectrumTextures[tex.first] = unboundedTex;
        textures.illuminantSpectrumTextures[tex.first] = illumTex;
    });

    LOG_VERBOSE("Loading serial textures");
    // And do the rest serially
    for (size_t index : serialFloatTextures) {
        const auto &tex = floatTextures[index];

        pbrt::Transform renderFromTexture = tex.second.renderFromObject.startTransform;
        TextureParameterDictionary texDict(&tex.second.parameters, &textures);
        FloatTextureHandle t = FloatTextureHandle::Create(
            tex.second.texName, renderFromTexture, texDict, &tex.second.loc, alloc, gpu);
        textures.floatTextures[tex.first] = t;
    }
    for (size_t index : serialSpectrumTextures) {
        const auto &tex = spectrumTextures[index];

        if (tex.second.renderFromObject.IsAnimated())
            Warning(&tex.second.loc, "Animated world to texture transform not supported. "
                                     "Using start transform.");

        pbrt::Transform renderFromTexture = tex.second.renderFromObject.startTransform;
        TextureParameterDictionary texDict(&tex.second.parameters, &textures);
        SpectrumTextureHandle albedoTex = SpectrumTextureHandle::Create(
            tex.second.texName, renderFromTexture, texDict, SpectrumType::Albedo,
            &tex.second.loc, alloc, gpu);
        SpectrumTextureHandle unboundedTex = SpectrumTextureHandle::Create(
            tex.second.texName, renderFromTexture, texDict, SpectrumType::Unbounded,
            &tex.second.loc, alloc, gpu);
        SpectrumTextureHandle illumTex = SpectrumTextureHandle::Create(
            tex.second.texName, renderFromTexture, texDict, SpectrumType::Illuminant,
            &tex.second.loc, alloc, gpu);

        textures.albedoSpectrumTextures[tex.first] = albedoTex;
        textures.unboundedSpectrumTextures[tex.first] = unboundedTex;
        textures.illuminantSpectrumTextures[tex.first] = illumTex;
    }

    LOG_VERBOSE("Done creating textures");
    return textures;
}